

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O1

FormattedNumber __thiscall
icu_63::number::LocalizedNumberFormatter::formatDecimal
          (LocalizedNumberFormatter *this,StringPiece value,UErrorCode *status)

{
  UNumberCompactStyle UVar1;
  UFormattedNumberData *results;
  char *pcVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  UFormattedNumberData *p;
  UNumberCompactStyle *in_R8;
  StringPiece n;
  FormattedNumber FVar3;
  
  if ((int)*in_R8 < 1) {
    results = (UFormattedNumberData *)UMemory::operator_new((UMemory *)0x158,(size_t)value.ptr_);
    if (results == (UFormattedNumberData *)0x0) {
      results = (UFormattedNumberData *)0x0;
      pcVar2 = extraout_RDX;
    }
    else {
      memset(results,0,0x158);
      results->fMagic = 0x46444e00;
      impl::DecimalQuantity::DecimalQuantity(&results->quantity);
      impl::NumberStringBuilder::NumberStringBuilder(&results->string);
      pcVar2 = extraout_RDX_00;
    }
    if (results == (UFormattedNumberData *)0x0) {
      *in_R8 = 7;
      UVar1 = 7;
    }
    else {
      n._8_8_ = (ulong)status & 0xffffffff;
      n.ptr_ = value._8_8_;
      impl::DecimalQuantity::setToDecNumber(&results->quantity,n,(UErrorCode *)in_R8);
      p = results;
      formatImpl((LocalizedNumberFormatter *)value.ptr_,results,(UErrorCode *)in_R8);
      if ((int)*in_R8 < 1) {
        UVar1 = UNUM_SHORT;
        pcVar2 = extraout_RDX_01;
        goto LAB_0025d722;
      }
      impl::NumberStringBuilder::~NumberStringBuilder(&results->string);
      impl::DecimalQuantity::~DecimalQuantity(&results->quantity);
      UMemory::operator_delete((UMemory *)results,p);
      UVar1 = *in_R8;
      pcVar2 = extraout_RDX_02;
    }
  }
  else {
    UVar1 = UNUM_LONG;
    pcVar2 = value._8_8_;
  }
  results = (UFormattedNumberData *)0x0;
LAB_0025d722:
  *(UFormattedNumberData **)
   &(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros =
       results;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.notation.
  fUnion.compactStyle = UVar1;
  FVar3._8_8_ = pcVar2;
  FVar3.fResults = (UFormattedNumberData *)this;
  return FVar3;
}

Assistant:

FormattedNumber LocalizedNumberFormatter::formatDecimal(StringPiece value, UErrorCode& status) const {
    if (U_FAILURE(status)) { return FormattedNumber(U_ILLEGAL_ARGUMENT_ERROR); }
    auto results = new UFormattedNumberData();
    if (results == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return FormattedNumber(status);
    }
    results->quantity.setToDecNumber(value, status);
    formatImpl(results, status);

    // Do not save the results object if we encountered a failure.
    if (U_SUCCESS(status)) {
        return FormattedNumber(results);
    } else {
        delete results;
        return FormattedNumber(status);
    }
}